

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_result.c
# Opt level: O2

int lgx_value_to_expr(lgx_value_t *v,lgx_expr_result_t *e)

{
  int iVar1;
  lgx_ht_node_t *node;
  lgx_value_t *dst;
  
  e->type = EXPR_LITERAL;
  iVar1 = 1;
  switch(v->type) {
  case T_LONG:
    (e->v_type).type = T_LONG;
    goto LAB_0012b1be;
  case T_DOUBLE:
    (e->v_type).type = T_DOUBLE;
    (e->v).l = (longlong)v->v;
    break;
  case T_BOOL:
    (e->v_type).type = T_BOOL;
LAB_0012b1be:
    (e->v).l = (longlong)v->v;
    break;
  case T_STRING:
    (e->v_type).type = T_STRING;
    iVar1 = lgx_str_init(&(e->v).str,(((v->v).str)->string).length);
    if (iVar1 != 0) {
      return 1;
    }
    lgx_str_dup(&((v->v).str)->string,&(e->v).str);
    break;
  case T_ARRAY:
    iVar1 = lgx_type_dup(&((v->v).gc)->type,&e->v_type);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = lgx_ht_init(&(e->v).arr,(((v->v).str)->string).length);
    if (iVar1 != 0) {
      lgx_type_cleanup(&e->v_type);
      return 1;
    }
    for (node = lgx_ht_first(&((v->v).arr)->table); node != (lgx_ht_node_t *)0x0;
        node = lgx_ht_next(node)) {
      dst = (lgx_value_t *)calloc(1,0x10);
      if (dst == (lgx_value_t *)0x0) {
        return 1;
      }
      iVar1 = lgx_value_dup((lgx_value_t *)node->v,dst);
      if (iVar1 != 0) {
LAB_0012b278:
        free(v);
        return 1;
      }
      iVar1 = lgx_ht_set(&(e->v).arr,&node->k,dst);
      if (iVar1 != 0) {
        lgx_value_cleanup(v);
        goto LAB_0012b278;
      }
    }
    break;
  default:
    goto switchD_0012b173_default;
  }
  iVar1 = 0;
switchD_0012b173_default:
  return iVar1;
}

Assistant:

int lgx_value_to_expr(lgx_value_t* v, lgx_expr_result_t* e) {
    e->type = EXPR_LITERAL;
    
    switch (v->type) {
        case T_LONG:
            e->v_type.type = T_LONG;
            e->v.l = v->v.l;
            break;
        case T_DOUBLE:
            e->v_type.type = T_DOUBLE;
            e->v.d = v->v.d;
            break;
        case T_BOOL:
            e->v_type.type = T_BOOL;
            e->v.l = v->v.l;
            break;
        case T_STRING:
            e->v_type.type = T_STRING;
            if (lgx_str_init(&e->v.str, v->v.str->string.length)) {
                return 1;
            }
            lgx_str_dup(&v->v.str->string, &e->v.str);
            break;
        case T_ARRAY:
            if (lgx_type_dup(&v->v.arr->gc.type, &e->v_type)) {
                return 1;
            }
            if (lgx_ht_init(&e->v.arr, v->v.arr->table.length)) {
                lgx_type_cleanup(&e->v_type);
                return 1;
            }
            lgx_ht_node_t* n;
            for (n = lgx_ht_first(&v->v.arr->table); n; n = lgx_ht_next(n)) {
                lgx_value_t* val = xcalloc(1, sizeof(lgx_value_t));
                if (!val) {
                    return 1;
                }
                if (lgx_value_dup((lgx_value_t*)n->v, val)) {
                    xfree(v);
                    return 1;
                }
                if (lgx_ht_set(&e->v.arr, &n->k, val)) {
                    lgx_value_cleanup(v);
                    xfree(v);
                    return 1;
                }
            }
            break;
        default:
            return 1;
    }

    return 0;
}